

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmtimer.cpp
# Opt level: O2

void __thiscall FM::Timer::SetTimerControl(Timer *this,uint data)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = this->regtc;
  this->regtc = (uint8)data;
  if ((data & 0x10) != 0) {
    (*this->_vptr_Timer[1])(this,1);
  }
  uVar2 = bVar1 ^ data;
  if ((data & 0x20) != 0) {
    (*this->_vptr_Timer[1])(this,2);
  }
  if ((uVar2 & 1) != 0) {
    this->timera_count = -(data & 1) & this->timera;
  }
  if ((uVar2 & 2) != 0) {
    this->timerb_count = (int)(data << 0x1e) >> 0x1f & this->timerb;
  }
  return;
}

Assistant:

void Timer::SetTimerControl(uint data)
{
	uint tmp = regtc ^ data;
	regtc = uint8(data);
	
	if (data & 0x10) 
		ResetStatus(1);
	if (data & 0x20) 
		ResetStatus(2);

	if (tmp & 0x01)
		timera_count = (data & 1) ? timera : 0;
	if (tmp & 0x02)
		timerb_count = (data & 2) ? timerb : 0;
}